

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rrMultisamplePixelBufferAccess.cpp
# Opt level: O3

MultisamplePixelBufferAccess *
rr::MultisamplePixelBufferAccess::fromSinglesampleAccess
          (MultisamplePixelBufferAccess *__return_storage_ptr__,PixelBufferAccess *original)

{
  IVec3 local_50;
  IVec3 local_44;
  PixelBufferAccess local_38;
  
  local_44.m_data[0] = 1;
  local_44.m_data._4_8_ = *(undefined8 *)(original->super_ConstPixelBufferAccess).m_size.m_data;
  local_50.m_data._4_8_ = *(undefined8 *)(original->super_ConstPixelBufferAccess).m_pitch.m_data;
  local_50.m_data[0] = local_50.m_data[1];
  tcu::PixelBufferAccess::PixelBufferAccess
            (&local_38,(TextureFormat *)original,&local_44,&local_50,
             (original->super_ConstPixelBufferAccess).m_data);
  (__return_storage_ptr__->m_access).super_ConstPixelBufferAccess.m_format =
       local_38.super_ConstPixelBufferAccess.m_format;
  (__return_storage_ptr__->m_access).super_ConstPixelBufferAccess.m_size.m_data[2] =
       local_38.super_ConstPixelBufferAccess.m_size.m_data[2];
  *(undefined8 *)(__return_storage_ptr__->m_access).super_ConstPixelBufferAccess.m_size.m_data =
       local_38.super_ConstPixelBufferAccess.m_size.m_data._0_8_;
  *(undefined8 *)(__return_storage_ptr__->m_access).super_ConstPixelBufferAccess.m_pitch.m_data =
       local_38.super_ConstPixelBufferAccess.m_pitch.m_data._0_8_;
  (__return_storage_ptr__->m_access).super_ConstPixelBufferAccess.m_pitch.m_data[2] =
       local_38.super_ConstPixelBufferAccess.m_pitch.m_data[2];
  (__return_storage_ptr__->m_access).super_ConstPixelBufferAccess.m_data =
       local_38.super_ConstPixelBufferAccess.m_data;
  return __return_storage_ptr__;
}

Assistant:

MultisamplePixelBufferAccess MultisamplePixelBufferAccess::fromSinglesampleAccess (const tcu::PixelBufferAccess& original)
{
	return MultisamplePixelBufferAccess(
				tcu::PixelBufferAccess(
								original.getFormat(),
								tcu::IVec3(1, original.getWidth(), original.getHeight()),
								tcu::IVec3(original.getPixelPitch(), original.getPixelPitch(), original.getRowPitch()),
								original.getDataPtr()));
}